

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse2_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  undefined1 (*pauVar2) [16];
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  parasail_result_t *ppVar16;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  bool bVar17;
  size_t len;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  __m128i *palVar21;
  __m128i *palVar22;
  long lVar23;
  uint uVar24;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  __m128i *palVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  undefined4 uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  int iVar36;
  ulong size;
  int iVar37;
  int iVar38;
  int iVar50;
  int iVar51;
  int iVar52;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i alVar49;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  __m128i alVar60;
  int iVar61;
  int iVar66;
  int iVar67;
  int iVar68;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  __m128i alVar65;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ulong uVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i alVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  undefined1 local_1f8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  long local_140;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int iVar25;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_scan_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar3 = (profile->profile32).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_stats_table_scan_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_scan_profile_sse2_128_32_cold_6();
      }
      else {
        uVar24 = profile->s1Len;
        if ((int)uVar24 < 1) {
          parasail_nw_stats_table_scan_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_scan_profile_sse2_128_32_cold_4();
        }
        else {
          uVar35 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_scan_profile_sse2_128_32_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_scan_profile_sse2_128_32_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_scan_profile_sse2_128_32_cold_1();
          }
          else {
            uVar28 = uVar24 - 1;
            size = (ulong)uVar24 + 3 >> 2;
            uVar7 = (ulong)uVar28 % size;
            iVar31 = -open;
            iVar12 = ppVar4->min;
            uVar34 = 0x80000000 - iVar12;
            if (iVar12 != iVar31 && SBORROW4(iVar12,iVar31) == iVar12 + open < 0) {
              uVar34 = open | 0x80000000;
            }
            pvVar5 = (profile->profile32).matches;
            iVar12 = 0x7ffffffe - ppVar4->max;
            local_1a8._0_4_ = iVar12;
            pvVar6 = (profile->profile32).similar;
            ppVar16 = parasail_result_new_table3((uint)((ulong)uVar24 + 3) & 0x7ffffffc,s2Len);
            if (ppVar16 != (parasail_result_t *)0x0) {
              iVar37 = (int)(uVar28 / size);
              ppVar16->flag = ppVar16->flag | 0x4430401;
              b = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              b_04 = parasail_memalign___m128i(0x10,size);
              b_05 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              ptr_04 = parasail_memalign___m128i(0x10,size);
              ptr_05 = parasail_memalign___m128i(0x10,size);
              uVar30 = 0x10;
              ptr_06 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1U));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = ptr_06 == (int32_t *)0x0;
              auVar79._0_4_ = -(uint)((int)b == 0);
              auVar79._4_4_ = -(uint)((int)((ulong)b >> 0x20) == 0);
              auVar79._8_4_ = -(uint)((int)b_00 == 0);
              auVar79._12_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0);
              auVar54._4_4_ = auVar79._0_4_;
              auVar54._0_4_ = auVar79._4_4_;
              auVar54._8_4_ = auVar79._12_4_;
              auVar54._12_4_ = auVar79._8_4_;
              auVar82._0_4_ = -(uint)((int)b_01 == 0);
              auVar82._4_4_ = -(uint)((int)((ulong)b_01 >> 0x20) == 0);
              auVar82._8_4_ = -(uint)((int)b_02 == 0);
              auVar82._12_4_ = -(uint)((int)((ulong)b_02 >> 0x20) == 0);
              auVar41._4_4_ = auVar82._0_4_;
              auVar41._0_4_ = auVar82._4_4_;
              auVar41._8_4_ = auVar82._12_4_;
              auVar41._12_4_ = auVar82._8_4_;
              auVar82 = packssdw(auVar54 & auVar79,auVar41 & auVar82);
              auVar75._0_4_ = -(uint)((int)ptr == 0);
              auVar75._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
              auVar75._8_4_ = -(uint)((int)b_03 == 0);
              auVar75._12_4_ = -(uint)((int)((ulong)b_03 >> 0x20) == 0);
              auVar77._4_4_ = auVar75._0_4_;
              auVar77._0_4_ = auVar75._4_4_;
              auVar77._8_4_ = auVar75._12_4_;
              auVar77._12_4_ = auVar75._8_4_;
              auVar83._0_4_ = -(uint)((int)b_04 == 0);
              auVar83._4_4_ = -(uint)((int)((ulong)b_04 >> 0x20) == 0);
              auVar83._8_4_ = -(uint)((int)b_05 == 0);
              auVar83._12_4_ = -(uint)((int)((ulong)b_05 >> 0x20) == 0);
              auVar101._4_4_ = auVar83._0_4_;
              auVar101._0_4_ = auVar83._4_4_;
              auVar101._8_4_ = auVar83._12_4_;
              auVar101._12_4_ = auVar83._8_4_;
              auVar78 = packssdw(auVar77 & auVar75,auVar101 & auVar83);
              auVar78 = packssdw(auVar82,auVar78);
              auVar83 = packsswb(auVar78,auVar78);
              auVar78._0_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar78._4_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              auVar78._8_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
              auVar78._12_4_ = -(uint)((int)ptr_03 == 0 && (int)((ulong)ptr_03 >> 0x20) == 0);
              uVar30 = movmskps(uVar30,auVar78);
              if (((ptr_05 != (__m128i *)0x0 && ptr_04 != (__m128i *)0x0) &&
                  ptr_06 != (int32_t *)0x0) &&
                  ((char)uVar30 == '\0' &&
                  ((((((((auVar83 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar83 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar83 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar83 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar83 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar83 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar83 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar83 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0))) {
                iVar13 = s2Len + -1;
                len = (size_t)(uint)gap;
                iVar14 = uVar34 + 1;
                iVar36 = (int)size;
                iVar15 = -(iVar36 * gap);
                c[0] = size;
                parasail_memset___m128i(b_03,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_04,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = size;
                parasail_memset___m128i(b_05,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = size;
                parasail_memset___m128i(b,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = size;
                parasail_memset___m128i(b_00,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = size;
                parasail_memset___m128i(b_01,c_04,len);
                c_05[1] = extraout_RDX_05;
                c_05[0] = size;
                parasail_memset___m128i(b_02,c_05,len);
                iVar61 = -open;
                iVar66 = -open;
                iVar67 = -open;
                iVar68 = -open;
                uVar18 = CONCAT44(0,iVar36 - 1);
                local_1f8._8_8_ = local_1f8._0_8_;
                local_1f8._0_8_ = uVar18;
                lVar19 = uVar18 << 4;
                iVar38 = 1;
                iVar50 = 1;
                iVar51 = 1;
                iVar52 = 1;
                uVar20 = size;
                do {
                  piVar1 = (int *)((long)*ptr_04 + lVar19);
                  *piVar1 = iVar61;
                  piVar1[1] = iVar66;
                  piVar1[2] = iVar67;
                  piVar1[3] = iVar68;
                  piVar1 = (int *)((long)*ptr_05 + lVar19);
                  *piVar1 = iVar38;
                  piVar1[1] = iVar50;
                  piVar1[2] = iVar51;
                  piVar1[3] = iVar52;
                  iVar61 = iVar61 - gap;
                  iVar66 = iVar66 - gap;
                  iVar67 = iVar67 - gap;
                  iVar68 = iVar68 - gap;
                  iVar38 = iVar38 + 1;
                  iVar50 = iVar50 + 1;
                  iVar51 = iVar51 + 1;
                  iVar52 = iVar52 + 1;
                  lVar19 = lVar19 + -0x10;
                  iVar25 = (int)uVar20;
                  uVar24 = iVar25 - 1;
                  uVar20 = (ulong)uVar24;
                } while (uVar24 != 0 && 0 < iVar25);
                uVar20 = 0;
                palVar26 = ptr;
                do {
                  auVar63._8_4_ = (int)uVar20;
                  auVar63._0_8_ = uVar20;
                  auVar63._12_4_ = (int)(uVar20 >> 0x20);
                  *(int *)*palVar26 = iVar31 - (int)((uVar20 & 0xffffffff) * (ulong)(uint)gap);
                  *(int *)((long)*palVar26 + 4) =
                       iVar31 - (int)((auVar63._8_8_ + size & 0xffffffff) * (ulong)(uint)gap);
                  *(int *)(*palVar26 + 1) =
                       iVar31 - (int)((size * 2 + uVar20 & 0xffffffff) * (ulong)(uint)gap);
                  *(int *)((long)*palVar26 + 0xc) =
                       iVar31 - (int)((size * 3 + auVar63._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                  uVar20 = uVar20 + 1;
                  palVar26 = palVar26 + 1;
                } while (size != uVar20);
                *ptr_06 = 0;
                auVar83 = _DAT_00903aa0;
                auVar78 = _DAT_00903a90;
                lVar19 = uVar35 - 1;
                auVar39._8_4_ = (int)lVar19;
                auVar39._0_8_ = lVar19;
                auVar39._12_4_ = (int)((ulong)lVar19 >> 0x20);
                uVar20 = 0;
                auVar39 = auVar39 ^ _DAT_00903aa0;
                do {
                  auVar74._8_4_ = (int)uVar20;
                  auVar74._0_8_ = uVar20;
                  auVar74._12_4_ = (int)(uVar20 >> 0x20);
                  auVar75 = (auVar74 | auVar78) ^ auVar83;
                  if ((bool)(~(auVar75._4_4_ == auVar39._4_4_ && auVar39._0_4_ < auVar75._0_4_ ||
                              auVar39._4_4_ < auVar75._4_4_) & 1)) {
                    ptr_06[uVar20 + 1] = iVar31;
                  }
                  if ((auVar75._12_4_ != auVar39._12_4_ || auVar75._8_4_ <= auVar39._8_4_) &&
                      auVar75._12_4_ <= auVar39._12_4_) {
                    ptr_06[uVar20 + 2] = iVar31 - gap;
                  }
                  uVar20 = uVar20 + 2;
                  iVar31 = iVar31 + gap * -2;
                } while ((s2Len + 1U & 0xfffffffe) != uVar20);
                palVar26 = ptr + uVar18;
                palVar21 = b_03 + uVar18;
                palVar22 = b_04 + uVar18;
                lVar32 = size * uVar35;
                lVar19 = lVar32 * 4;
                lVar33 = lVar32 * 8;
                lVar32 = lVar32 * 0xc;
                local_140 = 0;
                uVar20 = 0;
                local_128._4_4_ = iVar14;
                local_128._0_4_ = iVar14;
                local_128._12_4_ = iVar14;
                local_128._8_4_ = iVar14;
                local_118._4_4_ = iVar12;
                local_118._0_4_ = iVar12;
                local_118._12_4_ = iVar12;
                local_118._8_4_ = iVar12;
                do {
                  iStack_f4 = (int)(*palVar22)[0];
                  iStack_f0 = *(int *)((long)*palVar22 + 4);
                  iStack_ec = (int)(*palVar22)[1];
                  uVar73 = b_05[uVar18][0];
                  local_f8 = 0;
                  auVar88._0_8_ = uVar73 << 0x20;
                  auVar88._8_8_ = b_05[uVar18][1] << 0x20 | uVar73 >> 0x20;
                  auVar8._4_8_ = in_XMM13._8_8_;
                  auVar8._0_4_ = (int)(*palVar26)[0];
                  auVar98._0_8_ = auVar8._0_8_ << 0x20;
                  auVar98._8_4_ = *(undefined4 *)((long)*palVar26 + 4);
                  auVar98._12_4_ = (int)(*palVar26)[1];
                  auVar99._4_12_ = auVar98._4_12_;
                  auVar99._0_4_ = ptr_06[uVar20];
                  lVar23 = (long)ppVar4->mapper[(byte)s2[uVar20]] * size * 0x10;
                  auVar69._4_4_ = iVar14;
                  auVar69._0_4_ = iVar14;
                  auVar69._8_4_ = iVar14;
                  auVar69._12_4_ = iVar14;
                  auVar106._0_4_ = iVar14 - (int)(*ptr_04)[0];
                  auVar106._4_4_ = iVar14 - *(int *)((long)*ptr_04 + 4);
                  auVar106._8_4_ = iVar14 - (int)(*ptr_04)[1];
                  auVar106._12_4_ = iVar14 - *(int *)((long)*ptr_04 + 0xc);
                  auVar75 = (undefined1  [16])0x0;
                  lVar29 = 0;
                  local_1b8 = ZEXT816(0);
                  local_1c8 = ZEXT816(0);
                  auVar78 = local_1a8;
                  auVar83 = in_XMM8;
                  local_1a8._0_4_ = 0;
                  local_1a8._4_4_ = (int)(*palVar21)[0];
                  local_1a8._8_4_ = *(int *)((long)*palVar21 + 4);
                  local_1a8._12_4_ = (int)(*palVar21)[1];
                  do {
                    pauVar2 = (undefined1 (*) [16])((long)*ptr + lVar29);
                    auVar79 = *pauVar2;
                    piVar1 = (int *)((long)*b + lVar29);
                    auVar62._0_4_ = *(int *)*pauVar2 - open;
                    auVar62._4_4_ = *(int *)(*pauVar2 + 4) - open;
                    auVar62._8_4_ = *(int *)(*pauVar2 + 8) - open;
                    auVar62._12_4_ = *(int *)(*pauVar2 + 0xc) - open;
                    auVar53._0_4_ = *piVar1 - gap;
                    auVar53._4_4_ = piVar1[1] - gap;
                    auVar53._8_4_ = piVar1[2] - gap;
                    auVar53._12_4_ = piVar1[3] - gap;
                    auVar40._0_4_ = -(uint)(auVar53._0_4_ < auVar62._0_4_);
                    auVar40._4_4_ = -(uint)(auVar53._4_4_ < auVar62._4_4_);
                    auVar40._8_4_ = -(uint)(auVar53._8_4_ < auVar62._8_4_);
                    auVar40._12_4_ = -(uint)(auVar53._12_4_ < auVar62._12_4_);
                    auVar63 = auVar62 & auVar40 | ~auVar40 & auVar53;
                    auVar101 = *(undefined1 (*) [16])((long)*b_03 + lVar29);
                    auVar54 = auVar101 & auVar40 |
                              ~auVar40 & *(undefined1 (*) [16])((long)*b_00 + lVar29);
                    auVar82 = *(undefined1 (*) [16])((long)*b_04 + lVar29);
                    auVar39 = auVar82 & auVar40 |
                              ~auVar40 & *(undefined1 (*) [16])((long)*b_01 + lVar29);
                    auVar77 = *(undefined1 (*) [16])((long)*b_05 + lVar29);
                    auVar41 = ~auVar40 & *(undefined1 (*) [16])((long)*b_02 + lVar29) |
                              auVar77 & auVar40;
                    piVar1 = (int *)((long)*ptr_04 + lVar29);
                    auVar105._0_4_ = auVar106._0_4_ + *piVar1;
                    auVar105._4_4_ = auVar106._4_4_ + piVar1[1];
                    auVar105._8_4_ = auVar106._8_4_ + piVar1[2];
                    auVar105._12_4_ = auVar106._12_4_ + piVar1[3];
                    auVar103._0_4_ = -(uint)(auVar69._0_4_ < auVar105._0_4_);
                    auVar103._4_4_ = -(uint)(auVar69._4_4_ < auVar105._4_4_);
                    auVar103._8_4_ = -(uint)(auVar69._8_4_ < auVar105._8_4_);
                    auVar103._12_4_ = -(uint)(auVar69._12_4_ < auVar105._12_4_);
                    auVar69 = ~auVar103 & auVar69 | auVar105 & auVar103;
                    local_1c8 = local_1f8 & auVar103 | ~auVar103 & local_1c8;
                    piVar1 = (int *)((long)*ptr_05 + lVar29);
                    auVar84._0_4_ = auVar83._0_4_ + *piVar1;
                    auVar84._4_4_ = auVar83._4_4_ + piVar1[1];
                    auVar84._8_4_ = auVar83._8_4_ + piVar1[2];
                    auVar84._12_4_ = auVar83._12_4_ + piVar1[3];
                    local_1b8 = auVar78 & auVar103 | ~auVar103 & local_1b8;
                    piVar1 = (int *)((long)pvVar3 + lVar29 + lVar23);
                    auVar100._0_4_ = auVar99._0_4_ + *piVar1;
                    auVar100._4_4_ = auVar99._4_4_ + piVar1[1];
                    auVar100._8_4_ = auVar99._8_4_ + piVar1[2];
                    auVar100._12_4_ = auVar99._12_4_ + piVar1[3];
                    piVar1 = (int *)((long)pvVar5 + lVar29 + lVar23);
                    auVar96._0_4_ = local_1a8._0_4_ + *piVar1;
                    auVar96._4_4_ = local_1a8._4_4_ + piVar1[1];
                    auVar96._8_4_ = local_1a8._8_4_ + piVar1[2];
                    auVar96._12_4_ = local_1a8._12_4_ + piVar1[3];
                    auVar75 = ~auVar103 & auVar75 | auVar84 & auVar103;
                    piVar1 = (int *)((long)pvVar6 + lVar29 + lVar23);
                    auVar93._0_4_ = local_f8 + *piVar1;
                    auVar93._4_4_ = iStack_f4 + piVar1[1];
                    auVar93._8_4_ = iStack_f0 + piVar1[2];
                    auVar93._12_4_ = iStack_ec + piVar1[3];
                    auVar85._0_4_ = -(uint)(auVar100._0_4_ < auVar63._0_4_);
                    auVar85._4_4_ = -(uint)(auVar100._4_4_ < auVar63._4_4_);
                    auVar85._8_4_ = -(uint)(auVar100._8_4_ < auVar63._8_4_);
                    auVar85._12_4_ = -(uint)(auVar100._12_4_ < auVar63._12_4_);
                    *(undefined1 (*) [16])((long)*b + lVar29) = auVar63;
                    auVar106 = ~auVar85 & auVar100 | auVar63 & auVar85;
                    *(undefined1 (*) [16])((long)*b_00 + lVar29) = auVar54;
                    local_1f8 = ~auVar85 & auVar96 | auVar54 & auVar85;
                    *(undefined1 (*) [16])((long)*b_01 + lVar29) = auVar39;
                    auVar78 = ~auVar85 & auVar93 | auVar39 & auVar85;
                    auVar42._0_4_ = auVar41._0_4_ + 1;
                    auVar42._4_4_ = auVar41._4_4_ + 1;
                    auVar42._8_4_ = auVar41._8_4_ + 1;
                    auVar42._12_4_ = auVar41._12_4_ + 1;
                    auVar89._0_4_ = auVar88._0_4_ + 1;
                    auVar89._4_4_ = auVar88._4_4_ + 1;
                    auVar89._8_4_ = auVar88._8_4_ + 1;
                    auVar89._12_4_ = auVar88._12_4_ + 1;
                    *(undefined1 (*) [16])((long)*b_02 + lVar29) = auVar42;
                    auVar83 = ~auVar85 & auVar89 | auVar42 & auVar85;
                    *(undefined1 (*) [16])((long)*ptr + lVar29) = auVar100;
                    *(undefined1 (*) [16])((long)*b_03 + lVar29) = auVar96;
                    *(undefined1 (*) [16])((long)*b_04 + lVar29) = auVar93;
                    *(undefined1 (*) [16])((long)*b_05 + lVar29) = auVar89;
                    lVar29 = lVar29 + 0x10;
                    local_f8 = auVar82._0_4_;
                    iStack_f4 = auVar82._4_4_;
                    iStack_f0 = auVar82._8_4_;
                    iStack_ec = auVar82._12_4_;
                    local_1a8._0_4_ = auVar101._0_4_;
                    local_1a8._4_4_ = auVar101._4_4_;
                    local_1a8._8_4_ = auVar101._8_4_;
                    local_1a8._12_4_ = auVar101._12_4_;
                    auVar88 = auVar77;
                    auVar99 = auVar79;
                  } while (size << 4 != lVar29);
                  lVar23 = local_1f8._8_8_;
                  uVar73 = local_1f8._0_8_;
                  local_1f8._0_8_ = uVar73 << 0x20;
                  local_1f8._8_8_ = lVar23 << 0x20 | uVar73 >> 0x20;
                  local_1a8._0_8_ = auVar78._0_8_ << 0x20;
                  local_1a8._8_8_ = auVar78._8_8_ << 0x20 | auVar78._0_8_ >> 0x20;
                  in_XMM8._0_8_ = auVar83._0_8_ << 0x20;
                  in_XMM8._8_8_ = auVar83._8_8_ << 0x20 | auVar83._0_8_ >> 0x20;
                  iVar61 = auVar106._0_4_;
                  iVar66 = auVar106._4_4_;
                  iVar67 = auVar106._8_4_;
                  auVar9._4_8_ = auVar77._8_8_;
                  auVar9._0_4_ = iVar61;
                  auVar90._0_8_ = auVar9._0_8_ << 0x20;
                  auVar90._8_4_ = iVar66;
                  auVar90._12_4_ = iVar67;
                  iVar31 = ptr_06[uVar20 + 1];
                  uVar20 = uVar20 + 1;
                  auVar91._4_12_ = auVar90._4_12_;
                  auVar91._0_4_ = iVar31;
                  auVar43._0_4_ = (int)(*ptr_04)[0] + iVar31;
                  auVar43._4_4_ = *(int *)((long)*ptr_04 + 4) + iVar61;
                  auVar43._8_4_ = (int)(*ptr_04)[1] + iVar66;
                  auVar43._12_4_ = *(int *)((long)*ptr_04 + 0xc) + iVar67;
                  auVar104._0_4_ = -(uint)(auVar43._0_4_ < auVar69._0_4_);
                  auVar104._4_4_ = -(uint)(auVar43._4_4_ < auVar69._4_4_);
                  auVar104._8_4_ = -(uint)(auVar43._8_4_ < auVar69._8_4_);
                  auVar104._12_4_ = -(uint)(auVar43._12_4_ < auVar69._12_4_);
                  auVar78 = auVar69 & auVar104 | ~auVar104 & auVar43;
                  auVar82 = local_1c8 & auVar104 | ~auVar104 & local_1f8;
                  auVar101 = local_1b8 & auVar104 | ~auVar104 & local_1a8;
                  auVar44._4_4_ = *(int *)((long)*ptr_05 + 4) + auVar83._0_4_;
                  auVar44._0_4_ = (int)(*ptr_05)[0];
                  auVar44._8_4_ = (int)(*ptr_05)[1] + auVar83._4_4_;
                  auVar44._12_4_ = *(int *)((long)*ptr_05 + 0xc) + auVar83._8_4_;
                  auVar83 = ~auVar104 & auVar44 | auVar75 & auVar104;
                  bVar11 = true;
                  do {
                    bVar17 = bVar11;
                    auVar10._4_4_ = auVar83._4_4_ + iVar36;
                    auVar10._0_4_ = auVar83._0_4_ + iVar36;
                    auVar10._8_4_ = auVar83._8_4_ + iVar36;
                    auVar10._12_4_ = 0;
                    auVar55._4_4_ = auVar78._0_4_ + iVar15;
                    auVar55._0_4_ = iVar14;
                    auVar55._8_4_ = auVar78._4_4_ + iVar15;
                    auVar55._12_4_ = auVar78._8_4_ + iVar15;
                    auVar64._0_4_ = -(uint)(iVar14 < auVar78._0_4_);
                    auVar64._4_4_ = -(uint)(auVar55._4_4_ < auVar78._4_4_);
                    auVar64._8_4_ = -(uint)(auVar55._8_4_ < auVar78._8_4_);
                    auVar64._12_4_ = -(uint)(auVar55._12_4_ < auVar78._12_4_);
                    auVar78 = auVar78 & auVar64 | ~auVar64 & auVar55;
                    auVar56._0_8_ = auVar82._0_8_ << 0x20;
                    auVar56._8_8_ = auVar82._8_8_ << 0x20 | auVar82._0_8_ >> 0x20;
                    auVar82 = auVar82 & auVar64 | ~auVar64 & auVar56;
                    auVar57._0_8_ = auVar101._0_8_ << 0x20;
                    auVar57._8_8_ = auVar101._8_8_ << 0x20 | auVar101._0_8_ >> 0x20;
                    auVar101 = auVar101 & auVar64 | ~auVar64 & auVar57;
                    auVar83 = ~auVar64 & auVar10 << 0x20 | auVar83 & auVar64;
                    bVar11 = false;
                  } while (bVar17);
                  auVar95._0_8_ = auVar83._0_8_ << 0x20;
                  auVar95._8_8_ = auVar83._8_8_ << 0x20 | auVar83._0_8_ >> 0x20;
                  auVar71._4_4_ = auVar78._0_4_;
                  auVar71._0_4_ = iVar14;
                  auVar71._8_4_ = auVar78._4_4_;
                  auVar71._12_4_ = auVar78._8_4_;
                  auVar45._0_4_ = -(uint)(iVar31 < iVar14);
                  auVar45._4_4_ = -(uint)(iVar61 < auVar71._4_4_);
                  auVar45._8_4_ = -(uint)(iVar66 < auVar71._8_4_);
                  auVar45._12_4_ = -(uint)(iVar67 < auVar71._12_4_);
                  auVar78 = ~auVar45 & auVar91 | auVar71 & auVar45;
                  auVar92._0_8_ = auVar82._0_8_ << 0x20;
                  auVar92._8_8_ = auVar82._8_8_ << 0x20 | auVar82._0_8_ >> 0x20;
                  auVar83 = auVar92 & auVar45 | ~auVar45 & local_1f8;
                  auVar97._0_8_ = auVar101._0_8_ << 0x20;
                  auVar97._8_8_ = auVar101._8_8_ << 0x20 | auVar101._0_8_ >> 0x20;
                  auVar75 = auVar97 & auVar45 | ~auVar45 & local_1a8;
                  in_XMM13 = ~auVar45 & in_XMM8 | auVar95 & auVar45;
                  lVar29 = 0;
                  lVar23 = local_140;
                  do {
                    auVar86._0_4_ = auVar78._0_4_ - open;
                    auVar86._4_4_ = auVar78._4_4_ - open;
                    auVar86._8_4_ = auVar78._8_4_ - open;
                    auVar86._12_4_ = auVar78._12_4_ - open;
                    auVar70._0_4_ = auVar71._0_4_ - gap;
                    auVar70._4_4_ = auVar71._4_4_ - gap;
                    auVar70._8_4_ = auVar71._8_4_ - gap;
                    auVar70._12_4_ = auVar71._12_4_ - gap;
                    auVar94._0_4_ = -(uint)(auVar70._0_4_ < auVar86._0_4_);
                    auVar94._4_4_ = -(uint)(auVar70._4_4_ < auVar86._4_4_);
                    auVar94._8_4_ = -(uint)(auVar70._8_4_ < auVar86._8_4_);
                    auVar94._12_4_ = -(uint)(auVar70._12_4_ < auVar86._12_4_);
                    auVar101 = *(undefined1 (*) [16])((long)*ptr + lVar29);
                    auVar71 = auVar86 & auVar94 | ~auVar94 & auVar70;
                    auVar78 = *(undefined1 (*) [16])((long)*b + lVar29);
                    auVar82 = ~auVar94 & auVar95 | in_XMM13 & auVar94;
                    auVar92 = auVar83 & auVar94 | ~auVar94 & auVar92;
                    auVar87._0_4_ = -(uint)(auVar78._0_4_ < auVar101._0_4_);
                    auVar87._4_4_ = -(uint)(auVar78._4_4_ < auVar101._4_4_);
                    auVar87._8_4_ = -(uint)(auVar78._8_4_ < auVar101._8_4_);
                    auVar87._12_4_ = -(uint)(auVar78._12_4_ < auVar101._12_4_);
                    auVar97 = auVar75 & auVar94 | ~auVar94 & auVar97;
                    auVar78 = ~auVar87 & auVar78 | auVar101 & auVar87;
                    auVar46._0_4_ = -(uint)(auVar71._0_4_ < auVar78._0_4_);
                    auVar46._4_4_ = -(uint)(auVar71._4_4_ < auVar78._4_4_);
                    auVar46._8_4_ = -(uint)(auVar71._8_4_ < auVar78._8_4_);
                    auVar46._12_4_ = -(uint)(auVar71._12_4_ < auVar78._12_4_);
                    auVar78 = auVar78 & auVar46 | ~auVar46 & auVar71;
                    iVar31 = auVar78._0_4_;
                    auVar102._0_4_ = -(uint)(auVar101._0_4_ == iVar31);
                    iVar61 = auVar78._4_4_;
                    auVar102._4_4_ = -(uint)(auVar101._4_4_ == iVar61);
                    iVar66 = auVar78._8_4_;
                    auVar102._8_4_ = -(uint)(auVar101._8_4_ == iVar66);
                    iVar67 = auVar78._12_4_;
                    auVar102._12_4_ = -(uint)(auVar101._12_4_ == iVar67);
                    auVar83 = *(undefined1 (*) [16])((long)*b_03 + lVar29) & auVar102 |
                              ~auVar102 &
                              (~auVar46 & auVar92 |
                              *(undefined1 (*) [16])((long)*b_00 + lVar29) & auVar46);
                    auVar75 = *(undefined1 (*) [16])((long)*b_04 + lVar29) & auVar102 |
                              ~auVar102 &
                              (~auVar46 & auVar97 |
                              *(undefined1 (*) [16])((long)*b_01 + lVar29) & auVar46);
                    auVar95._0_4_ = auVar82._0_4_ + 1;
                    auVar95._4_4_ = auVar82._4_4_ + 1;
                    auVar95._8_4_ = auVar82._8_4_ + 1;
                    auVar95._12_4_ = auVar82._12_4_ + 1;
                    in_XMM13 = auVar102 & *(undefined1 (*) [16])((long)*b_05 + lVar29) |
                               ~auVar102 &
                               (~auVar46 & auVar95 |
                               *(undefined1 (*) [16])((long)*b_02 + lVar29) & auVar46);
                    auVar58._0_4_ = -(uint)(iVar31 < local_118._0_4_);
                    auVar58._4_4_ = -(uint)(iVar61 < local_118._4_4_);
                    auVar58._8_4_ = -(uint)(iVar66 < local_118._8_4_);
                    auVar58._12_4_ = -(uint)(iVar67 < local_118._12_4_);
                    auVar47._0_4_ = -(uint)(iVar31 < local_128._0_4_);
                    auVar47._4_4_ = -(uint)(iVar61 < local_128._4_4_);
                    auVar47._8_4_ = -(uint)(iVar66 < local_128._8_4_);
                    auVar47._12_4_ = -(uint)(iVar67 < local_128._12_4_);
                    auVar101 = ~auVar47 & auVar78 | local_128 & auVar47;
                    *(undefined1 (*) [16])((long)*ptr + lVar29) = auVar78;
                    *(undefined1 (*) [16])((long)*b_03 + lVar29) = auVar83;
                    *(undefined1 (*) [16])((long)*b_04 + lVar29) = auVar75;
                    *(undefined1 (*) [16])((long)*b_05 + lVar29) = in_XMM13;
                    local_118 = ~auVar58 & local_118 | auVar78 & auVar58;
                    lVar27 = *((ppVar16->field_4).trace)->trace_del_table;
                    *(int *)(lVar27 + lVar23) = iVar31;
                    lVar27 = lVar27 + lVar23;
                    *(int *)(lVar19 + lVar27) = iVar61;
                    *(int *)(lVar33 + lVar27) = iVar66;
                    *(int *)(lVar32 + lVar27) = iVar67;
                    auVar59._0_4_ = -(uint)(auVar83._0_4_ < auVar101._0_4_);
                    auVar59._4_4_ = -(uint)(auVar83._4_4_ < auVar101._4_4_);
                    auVar59._8_4_ = -(uint)(auVar83._8_4_ < auVar101._8_4_);
                    auVar59._12_4_ = -(uint)(auVar83._12_4_ < auVar101._12_4_);
                    auVar101 = ~auVar59 & auVar83 | auVar101 & auVar59;
                    lVar27 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar27 + lVar23) = auVar83._0_4_;
                    lVar27 = lVar27 + lVar23;
                    *(int *)(lVar19 + lVar27) = auVar83._4_4_;
                    *(int *)(lVar33 + lVar27) = auVar83._8_4_;
                    *(int *)(lVar32 + lVar27) = auVar83._12_4_;
                    auVar48._0_4_ = -(uint)(auVar75._0_4_ < auVar101._0_4_);
                    auVar48._4_4_ = -(uint)(auVar75._4_4_ < auVar101._4_4_);
                    auVar48._8_4_ = -(uint)(auVar75._8_4_ < auVar101._8_4_);
                    auVar48._12_4_ = -(uint)(auVar75._12_4_ < auVar101._12_4_);
                    auVar101 = ~auVar48 & auVar75 | auVar101 & auVar48;
                    lVar27 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar27 + lVar23) = auVar75._0_4_;
                    lVar27 = lVar27 + lVar23;
                    *(int *)(lVar19 + lVar27) = auVar75._4_4_;
                    *(int *)(lVar33 + lVar27) = auVar75._8_4_;
                    *(int *)(lVar32 + lVar27) = auVar75._12_4_;
                    auVar80._0_4_ = -(uint)(in_XMM13._0_4_ < auVar101._0_4_);
                    auVar80._4_4_ = -(uint)(in_XMM13._4_4_ < auVar101._4_4_);
                    auVar80._8_4_ = -(uint)(in_XMM13._8_4_ < auVar101._8_4_);
                    auVar80._12_4_ = -(uint)(in_XMM13._12_4_ < auVar101._12_4_);
                    local_128 = ~auVar80 & in_XMM13 | auVar101 & auVar80;
                    lVar27 = *(long *)((long)((ppVar16->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar27 + lVar23) = in_XMM13._0_4_;
                    lVar27 = lVar27 + lVar23;
                    *(int *)(lVar19 + lVar27) = in_XMM13._4_4_;
                    *(int *)(lVar33 + lVar27) = in_XMM13._8_4_;
                    *(int *)(lVar32 + lVar27) = in_XMM13._12_4_;
                    lVar29 = lVar29 + 0x10;
                    lVar23 = lVar23 + uVar35 * 4;
                  } while (size << 4 != lVar29);
                  local_140 = local_140 + 4;
                } while (uVar20 != uVar35);
                iVar31 = (int)uVar7 * 0x10;
                alVar76 = ptr[uVar7];
                alVar65 = b_03[uVar7];
                alVar60 = b_04[uVar7];
                alVar49 = b_05[uVar7];
                if (iVar37 < 3) {
                  iVar31 = 0;
                  do {
                    lVar19 = alVar76[1];
                    uVar35 = alVar76[0];
                    alVar76[0] = uVar35 << 0x20;
                    alVar76[1] = lVar19 << 0x20 | uVar35 >> 0x20;
                    lVar19 = alVar65[1];
                    uVar35 = alVar65[0];
                    alVar65[0] = uVar35 << 0x20;
                    alVar65[1] = lVar19 << 0x20 | uVar35 >> 0x20;
                    lVar19 = alVar60[1];
                    uVar35 = alVar60[0];
                    alVar60[0] = uVar35 << 0x20;
                    alVar60[1] = lVar19 << 0x20 | uVar35 >> 0x20;
                    lVar19 = alVar49[1];
                    uVar35 = alVar49[0];
                    alVar49[0] = uVar35 << 0x20;
                    alVar49[1] = lVar19 << 0x20 | uVar35 >> 0x20;
                    iVar31 = iVar31 + 1;
                  } while (iVar31 < 3 - iVar37);
                }
                auVar72._0_4_ = -(uint)((int)local_118._0_4_ < iVar14);
                auVar72._4_4_ = -(uint)((int)local_118._4_4_ < iVar14);
                auVar72._8_4_ = -(uint)((int)local_118._8_4_ < iVar14);
                auVar72._12_4_ = -(uint)((int)local_118._12_4_ < iVar14);
                auVar81._0_4_ = -(uint)(iVar12 < (int)local_128._0_4_);
                auVar81._4_4_ = -(uint)(iVar12 < (int)local_128._4_4_);
                auVar81._8_4_ = -(uint)(iVar12 < (int)local_128._8_4_);
                auVar81._12_4_ = -(uint)(iVar12 < (int)local_128._12_4_);
                iVar12 = movmskps(iVar31,auVar81 | auVar72);
                if (iVar12 == 0) {
                  iVar12 = alVar76[1]._4_4_;
                  iVar31 = alVar65[1]._4_4_;
                  iVar37 = alVar60[1]._4_4_;
                  iVar61 = alVar49[1]._4_4_;
                }
                else {
                  *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                  iVar12 = 0;
                  iVar31 = 0;
                  iVar37 = 0;
                  iVar61 = 0;
                  iVar13 = 0;
                  uVar28 = 0;
                }
                ppVar16->score = iVar12;
                ppVar16->end_query = uVar28;
                ppVar16->end_ref = iVar13;
                ((ppVar16->field_4).stats)->matches = iVar31;
                ((ppVar16->field_4).stats)->similar = iVar37;
                ((ppVar16->field_4).stats)->length = iVar61;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar16;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vHM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vHS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8_rpl(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8_rpl(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8_rpl(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8_rpl(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8_rpl(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8_rpl(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32_rpl(vF, vFt);
            vFM = _mm_blendv_epi8_rpl(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32_rpl(vF, vHt);
        vHM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8_rpl(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vHM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vHS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32_rpl(vHp, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        matches = (int32_t) _mm_extract_epi32_rpl (vHM, 3);
        similar = (int32_t) _mm_extract_epi32_rpl (vHS, 3);
        length = (int32_t) _mm_extract_epi32_rpl (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}